

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::rust::GetFullyQualifiedPath<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,rust *this,Context *ctx,EnumDescriptor *desc)

{
  bool bVar1;
  string_view sVar2;
  string_view name;
  string rel_path;
  string local_e8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  size_type local_48;
  char *local_40;
  
  GetCrateRelativeQualifiedPath_abi_cxx11_(&local_e8,this,ctx,desc);
  bVar1 = IsInCurrentlyGeneratingCrate((Context *)this,(EnumDescriptor *)ctx);
  if (bVar1) {
    local_78.piece_._M_len = 7;
    local_78.piece_._M_str = "crate::";
    local_a8.piece_._M_len = local_e8._M_string_length;
    local_a8.piece_._M_str = local_e8._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78);
  }
  else {
    sVar2._M_str = (char *)**(undefined8 **)(ctx->printer_ + 8);
    sVar2._M_len = (*(undefined8 **)(ctx->printer_ + 8))[1];
    sVar2 = Context::ImportPathToCrateName((Context *)this,sVar2);
    name._M_len = sVar2._M_str;
    name._M_str = (char *)desc;
    RsSafeName_abi_cxx11_(&local_c8,(rust *)sVar2._M_len,name);
    local_78.piece_._M_len = local_c8._M_string_length;
    local_78.piece_._M_str = local_c8._M_dataplus._M_p;
    local_a8.piece_._M_len = 2;
    local_a8.piece_._M_str = "::";
    local_48 = local_e8._M_string_length;
    local_40 = local_e8._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullyQualifiedPath(Context& ctx, const Desc& desc) {
  auto rel_path = GetCrateRelativeQualifiedPath(ctx, desc);
  if (IsInCurrentlyGeneratingCrate(ctx, desc)) {
    return absl::StrCat("crate::", rel_path);
  }
  return absl::StrCat(GetCrateName(ctx, *desc.file()), "::", rel_path);
}